

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O3

int ndiffs(double *x,int N,double *alpha,char *test,char *type,int *max_d)

{
  uint uVar1;
  int iVar2;
  double *sig;
  double *oup;
  uint uVar3;
  size_t __size;
  char *__s;
  double local_40;
  uint local_34;
  
  if (alpha == (double *)0x0) {
    local_40 = 0.05;
  }
  else {
    local_40 = *alpha;
  }
  if (max_d == (int *)0x0) {
    local_34 = 2;
  }
  else {
    local_34 = *max_d;
    if ((int)local_34 < 0) {
      puts("Error. Maximum Difference cannot be less than 0 ");
      exit(-1);
    }
  }
  if (0.01 <= local_40) {
    if (local_40 <= 0.1) goto LAB_001339f6;
    local_40 = 0.1;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. ";
  }
  else {
    local_40 = 0.01;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. ";
  }
  puts(__s);
LAB_001339f6:
  iVar2 = checkConstant(x,N);
  uVar3 = 0;
  if (iVar2 != 1) {
    iVar2 = runstattests(x,N,test,type,local_40);
    __size = (long)N << 3;
    sig = (double *)malloc(__size);
    oup = (double *)malloc(__size);
    memcpy(sig,x,__size);
    uVar3 = 0;
    if (local_34 != 0 && iVar2 != 0) {
      uVar1 = 1;
      while( true ) {
        uVar3 = uVar1;
        N = diff(sig,N,1,oup);
        iVar2 = checkConstant(oup,N);
        if (iVar2 == 1) break;
        iVar2 = runstattests(oup,N,test,type,local_40);
        memcpy(sig,oup,(long)N << 3);
        if ((iVar2 == 0) || (uVar1 = uVar3 + 1, local_34 <= uVar3)) break;
      }
    }
    free(sig);
    free(oup);
  }
  return uVar3;
}

Assistant:

int ndiffs(double *x, int N,double *alpha, const char *test,const char *type, int *max_d) {
    int d,max_d_,cc,NX,dodiff;
    double alpha_;
    double *y,*z;

    d = 0;

    alpha_ = alpha == NULL ? 0.05 : *alpha;
    max_d_ = max_d == NULL ? 2 : *max_d;

    // printf("%g \n",alpha_);

    if (max_d_ < 0) {
        printf("Error. Maximum Difference cannot be less than 0 \n");
        exit(-1);
    } 

    if (alpha_ < 0.01) {
        alpha_ = 0.01;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
    }

    if (alpha_ > 0.1) {
        alpha_ = 0.1;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
    }

    cc = checkConstant(x,N);

    if (cc == 1) return d;

    NX = N;

    dodiff = runstattests(x,N,test,type,alpha_);


    if (dodiff != dodiff) return d;

    y = (double*)malloc(sizeof(double)*NX);
    z = (double*)malloc(sizeof(double)*NX);

    memcpy(y,x,sizeof(double)*NX);

    while (dodiff && d < max_d_) {

        d++;
        //printf("d %d \n",d);

        NX = diff(y,NX,1,z);

        cc = checkConstant(z,NX);

        //printf("cc %d \n",cc);

        if (cc == 1) break;

        dodiff = runstattests(z,NX,test,type,alpha_);

        //printf("dodiff %d \n",dodiff);

        if (dodiff != dodiff) {
            d--;
            break;
        }

        memcpy(y,z,sizeof(double)*NX);
    }

    free(y);
    free(z);

    return d;
}